

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_string.h
# Opt level: O0

int JetHead::stl_vsprintf<std::__cxx11::string>
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,char *format,
              __va_list_tag *params)

{
  int iVar1;
  char *__s;
  undefined8 uStack_38;
  int size;
  va_list p2;
  __va_list_tag *params_local;
  char *format_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_local;
  
  p2[0].overflow_arg_area = params->reg_save_area;
  uStack_38._0_4_ = params->gp_offset;
  uStack_38._4_4_ = params->fp_offset;
  p2[0]._0_8_ = params->overflow_arg_area;
  p2[0].reg_save_area = params;
  vsnprintf((char *)0x0,0,format,params);
  std::__cxx11::string::resize((ulong)str);
  __s = (char *)std::__cxx11::string::c_str();
  iVar1 = vsprintf(__s,format,&uStack_38);
  return iVar1;
}

Assistant:

int		stl_vsprintf( _string &str, const char *format, va_list params )
	{
		va_list p2;
		va_copy( p2, params );
		int size = ::vsnprintf( NULL, 0, format, params );
		str.resize( size );
		return ::vsprintf( (char*)str.c_str(), format, p2 );
		va_end( p2 );
	}